

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.cpp
# Opt level: O3

bool __thiscall
FState::CallAction(FState *this,AActor *self,AActor *stateowner,FStateParamInfo *info,
                  FState **stateret)

{
  PPrototype *pPVar1;
  int iVar2;
  FString *this_00;
  VMFunction *pVVar3;
  VMFunction *func;
  long lVar4;
  VMValue params [3];
  VMReturn ret;
  anon_union_16_5_cf148060_for_VMValue_0 local_88;
  AActor *local_78;
  undefined4 local_70;
  undefined1 local_6c;
  FString local_68;
  undefined4 local_60;
  char local_5c [12];
  FStateParamInfo *local_50;
  VMFunction *local_48;
  VMReturn local_40;
  
  pVVar3 = this->ActionFunc;
  if (pVVar3 == (VMFunction *)0x0) goto LAB_004ed853;
  local_50 = info;
  local_48 = pVVar3;
  clock_gettime(1,(timespec *)&local_88.field_1);
  ActionCycles.Sec =
       ActionCycles.Sec -
       ((double)CONCAT44(local_88.biggest.foo[3],local_88.field_1.atag) * 1e-09 + (double)local_88.f
       );
  if (CallAction(AActor*,AActor*,FStateParamInfo*,FState**)::stack == '\0') {
    iVar2 = __cxa_guard_acquire(&CallAction(AActor*,AActor*,FStateParamInfo*,FState**)::stack);
    if (iVar2 != 0) {
      VMFrameStack::VMFrameStack(&CallAction::stack);
      __cxa_atexit(VMFrameStack::~VMFrameStack,&CallAction::stack,&__dso_handle);
      __cxa_guard_release(&CallAction(AActor*,AActor*,FStateParamInfo*,FState**)::stack);
    }
  }
  pVVar3 = local_48;
  local_88.field_1.atag = 1;
  local_88.field_3.Type = 3;
  local_70 = 1;
  local_6c = 3;
  local_68.Chars = (char *)local_50;
  local_60 = 8;
  local_5c[0] = 3;
  local_88.field_1.a = self;
  local_78 = stateowner;
  if (stateret == (FState **)0x0) {
    func = this->ActionFunc;
LAB_004ed7cc:
    VMFrameStack::Call(&CallAction::stack,func,(VMValue *)&local_88.field_1,3,(VMReturn *)0x0,0,
                       (VMException **)0x0);
  }
  else {
    *stateret = (FState *)0x0;
    func = this->ActionFunc;
    pPVar1 = func->Proto;
    if (((pPVar1 == (PPrototype *)0x0) || ((pPVar1->ReturnTypes).Count == 0)) ||
       (*(pPVar1->ReturnTypes).Array != (PType *)TypeState)) goto LAB_004ed7cc;
    local_40.TagOfs = 0;
    local_40.RegType = '\x03';
    local_40.Location = stateret;
    VMFrameStack::Call(&CallAction::stack,func,(VMValue *)&local_88.field_1,3,&local_40,1,
                       (VMException **)0x0);
  }
  clock_gettime(1,(timespec *)&local_40);
  ActionCycles.Sec =
       (double)CONCAT53(local_40._11_5_,CONCAT12(local_40.RegType,local_40.TagOfs)) * 1e-09 +
       (double)(long)local_40.Location + ActionCycles.Sec;
  lVar4 = -0x30;
  this_00 = &local_68;
  do {
    if (*(char *)((long)&this_00[1].Chars + 4) == '\x02') {
      FString::~FString(this_00);
    }
    this_00 = this_00 + -2;
    lVar4 = lVar4 + 0x10;
  } while (lVar4 != 0);
LAB_004ed853:
  return pVVar3 != (VMFunction *)0x0;
}

Assistant:

bool FState::CallAction(AActor *self, AActor *stateowner, FStateParamInfo *info, FState **stateret)
{
	if (ActionFunc != NULL)
	{
		ActionCycles.Clock();

		static VMFrameStack stack;
		VMValue params[3] = { self, stateowner, VMValue(info, ATAG_STATEINFO) };
		// If the function returns a state, store it at *stateret.
		// If it doesn't return a state but stateret is non-NULL, we need
		// to set *stateret to NULL.
		if (stateret != NULL)
		{
			*stateret = NULL;
			if (ActionFunc->Proto == NULL ||
				ActionFunc->Proto->ReturnTypes.Size() == 0 ||
				ActionFunc->Proto->ReturnTypes[0] != TypeState)
			{
				stateret = NULL;
			}
		}
		if (stateret == NULL)
		{
			stack.Call(ActionFunc, params, countof(params), NULL, 0, NULL);
		}
		else
		{
			VMReturn ret;
			ret.PointerAt((void **)stateret);
			stack.Call(ActionFunc, params, countof(params), &ret, 1, NULL);
		}
		ActionCycles.Unclock();
		return true;
	}
	else
	{
		return false;
	}
}